

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

EncodedCharPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::FScanNumber
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr p,double *pdbl,
          LikelyNumberType *likelyType,size_t savedMultiUnits)

{
  byte *pbVar1;
  byte *end;
  ThreadConfiguration *pTVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  char16 cVar6;
  long lVar7;
  undefined4 *puVar8;
  EncodedCharPtr s;
  double dVar9;
  byte *local_50;
  EncodedCharPtr startingLocation;
  uint local_3c;
  byte *pbStack_38;
  codepoint_t outChar;
  EncodedCharPtr pchT;
  
  end = this->m_pchLast;
  pbStack_38 = (byte *)0x0;
  *likelyType = Int;
  this->field_0x508 = this->field_0x508 & 0xfb;
  startingLocation = (EncodedCharPtr)savedMultiUnits;
  if ((p < end) && (*p == '0')) {
    pbVar1 = p + 1;
    if (pbVar1 < end) {
      bVar4 = *pbVar1;
    }
    else {
      bVar4 = 0;
    }
    if (bVar4 < 0x62) {
      if (bVar4 < 0x45) {
        if (bVar4 == 0x2e) goto LAB_00f16477;
        if (bVar4 == 0x42) goto LAB_00f1658b;
      }
      else {
        if (bVar4 == 0x45) {
LAB_00f16477:
          *likelyType = Double;
          goto LAB_00f1647e;
        }
        if (bVar4 == 0x4f) goto LAB_00f165d9;
        if (bVar4 == 0x58) goto LAB_00f165b2;
      }
LAB_00f166cf:
      dVar9 = Js::NumberUtilities::DblFromOctal<unsigned_char>(p,&stack0xffffffffffffffc8,false);
      *pdbl = dVar9;
      if (pbStack_38 <= p) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x295,"(pchT > p)","pchT > p");
        if (!bVar5) goto LAB_00f167ad;
        *puVar8 = 0;
      }
      if (pbVar1 < pbStack_38 || *pdbl != 0.0) {
        this->field_0x508 = this->field_0x508 | 4;
      }
      if ((*pbStack_38 & 0xfe) == 0x38) {
        this->field_0x508 = this->field_0x508 & 0xfb;
        goto LAB_00f1647e;
      }
      goto LAB_00f1660d;
    }
    if (bVar4 < 0x6e) {
      if (bVar4 != 0x62) {
        if (bVar4 == 0x65) goto LAB_00f16477;
        goto LAB_00f166cf;
      }
LAB_00f1658b:
      dVar9 = Js::NumberUtilities::DblFromBinary<unsigned_char>
                        (p + 2,&stack0xffffffffffffffc8,
                         ((this->m_scriptContext->config).threadConfig)->m_ESNumericSeparator);
    }
    else if (bVar4 == 0x78) {
LAB_00f165b2:
      dVar9 = Js::NumberUtilities::DblFromHex<unsigned_char>
                        (p + 2,&stack0xffffffffffffffc8,
                         ((this->m_scriptContext->config).threadConfig)->m_ESNumericSeparator);
    }
    else {
      if (bVar4 != 0x6f) {
        if (bVar4 == 0x6e) goto LAB_00f16477;
        goto LAB_00f166cf;
      }
LAB_00f165d9:
      dVar9 = Js::NumberUtilities::DblFromOctal<unsigned_char>
                        (p + 2,&stack0xffffffffffffffc8,
                         ((this->m_scriptContext->config).threadConfig)->m_ESNumericSeparator);
    }
    *pdbl = dVar9;
    if (pbStack_38 != p + 2) goto LAB_00f1660d;
    *pdbl = 0.0;
    lVar7 = 1;
    pbStack_38 = pbVar1;
  }
  else {
LAB_00f1647e:
    pTVar2 = (this->m_scriptContext->config).threadConfig;
    dVar9 = Js::NumberUtilities::StrToDbl<unsigned_char>
                      (p,&stack0xffffffffffffffc8,likelyType,pTVar2->m_ESBigInt,
                       pTVar2->m_ESNumericSeparator);
    *pdbl = dVar9;
    if ((pbStack_38 != p) && (bVar5 = Js::NumberUtilities::IsNan(dVar9), bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x2ae,"(pchT == p || !Js::NumberUtilities::IsNan(*pdbl))",
                         "pchT == p || !Js::NumberUtilities::IsNan(*pdbl)");
      if (!bVar5) goto LAB_00f167ad;
      *puVar8 = 0;
    }
    if ((*likelyType == BigInt) && ((*pdbl != 0.0 || (NAN(*pdbl))))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x2b1,"(*pdbl == 0)","*pdbl == 0");
      if (!bVar5) {
LAB_00f167ad:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
LAB_00f1660d:
    lVar7 = 0;
  }
  pbVar1 = pbStack_38 + lVar7;
  bVar4 = pbStack_38[lVar7];
  local_3c = (uint)(ushort)bVar4;
  local_50 = pbVar1;
  if ((char)bVar4 < '\0') {
    cVar6 = utf8::DecodeTail((ushort)bVar4,&local_50,end,
                             &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions,
                             (bool *)0x0);
    (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
         (size_t)(local_50 +
                 ((this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits - (long)pbVar1));
    local_3c = (uint)(ushort)cVar6;
  }
  bVar5 = Js::CharClassifier::IsIdStart(this->charClassifier,local_3c);
  if (bVar5) {
LAB_00f16783:
    (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = (size_t)startingLocation;
    Error(this,-0x7ff5fc07);
  }
  if (*pbStack_38 == 0x5c) {
    local_50 = local_50 + 1;
    bVar5 = TryReadEscape(this,&local_50,this->m_pchLast,&local_3c);
    if (bVar5) goto LAB_00f16783;
  }
  bVar5 = Js::NumberUtilities::IsDigit((uint)*local_50);
  if (bVar5) {
    (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = (size_t)startingLocation;
    Error(this,-0x7ff5fc0b);
  }
  return pbStack_38;
}

Assistant:

typename Scanner<EncodingPolicy>::EncodedCharPtr Scanner<EncodingPolicy>::FScanNumber(EncodedCharPtr p, double *pdbl, LikelyNumberType& likelyType, size_t savedMultiUnits)
{
    EncodedCharPtr last = m_pchLast;
    EncodedCharPtr pchT = nullptr;
    bool baseSpecified = false;
    likelyType = LikelyNumberType::Int;
    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;

    auto baseSpecifierCheck = [&pchT, &pdbl, p, &baseSpecified]()
    {
        if (pchT == p + 2)
        {
            // An octal token '0' was followed by a base specifier: /0[xXoObB]/
            // This literal can no longer be a double
            *pdbl = 0;
            // Advance the character pointer to the base specifier
            pchT = p + 1;
            // Set the flag so we know to offset the potential identifier search after the literal
            baseSpecified = true;
        }
    };

    if ('0' == this->PeekFirst(p, last))
    {
        switch(this->PeekFirst(p + 1, last))
        {
        case '.':
        case 'e':
        case 'E':
        case 'n':
            likelyType = LikelyNumberType::Double;
            // Floating point
            goto LFloat;

        case 'x':
        case 'X':
            // Hex
            *pdbl = Js::NumberUtilities::DblFromHex(p + 2, &pchT, m_scriptContext->GetConfig()->IsESNumericSeparatorEnabled());
            baseSpecifierCheck();
            goto LIdCheck;
        case 'o':
        case 'O':
            // Octal
            *pdbl = Js::NumberUtilities::DblFromOctal(p + 2, &pchT, m_scriptContext->GetConfig()->IsESNumericSeparatorEnabled());
            baseSpecifierCheck();
            goto LIdCheck;

        case 'b':
        case 'B':
            // Binary
            *pdbl = Js::NumberUtilities::DblFromBinary(p + 2, &pchT, m_scriptContext->GetConfig()->IsESNumericSeparatorEnabled());
            baseSpecifierCheck();
            goto LIdCheck;

        default:
            // Octal
            *pdbl = Js::NumberUtilities::DblFromOctal(p, &pchT);
            Assert(pchT > p);

#if !SOURCERELEASE
            // If an octal literal is malformed then it is in fact a decimal literal.
#endif // !SOURCERELEASE
            if(*pdbl != 0 || pchT > p + 1)
                m_OctOrLeadingZeroOnLastTKNumber = true; //report as an octal or hex for JSON when leading 0. Just '0' is ok

            switch (*pchT)
            {
            case '8':
            case '9':
                //            case 'e':
                //            case 'E':
                //            case '.':
                m_OctOrLeadingZeroOnLastTKNumber = false;  //08...  or 09....
                goto LFloat;
            }
            goto LIdCheck;
        }
    }
    else
    {
LFloat:
        *pdbl = Js::NumberUtilities::StrToDbl(p, &pchT, likelyType, m_scriptContext->GetConfig()->IsESBigIntEnabled(), m_scriptContext->GetConfig()->IsESNumericSeparatorEnabled());
        Assert(pchT == p || !Js::NumberUtilities::IsNan(*pdbl));
        if (likelyType == LikelyNumberType::BigInt)
        {
            Assert(*pdbl == 0);
        }
        // fall through to LIdCheck
    }

LIdCheck:
    // https://tc39.github.io/ecma262/#sec-literals-numeric-literals
    // The SourceCharacter immediately following a NumericLiteral must not be an IdentifierStart or DecimalDigit.
    // For example : 3in is an error and not the two input elements 3 and in
    // If a base was speficied, use the first character denoting the constant. In this case, pchT is pointing to the base specifier.
    EncodedCharPtr startingLocation = baseSpecified ? pchT + 1 : pchT;
    codepoint_t outChar = *startingLocation;
    if (this->IsMultiUnitChar((OLECHAR)outChar))
    {
        outChar = this->template ReadRest<true>((OLECHAR)outChar, startingLocation, last);
    }
    if (this->charClassifier->IsIdStart(outChar))
    {
        this->RestoreMultiUnits(savedMultiUnits);
        Error(ERRIdAfterLit);
    }

    // IsIdStart does not cover the unicode escape case. Try to read a unicode escape from the 'u' char.
    if (*pchT == '\\')
    {
        startingLocation++; // TryReadEscape expects us to point to the 'u', and since it is by reference we need to do it beforehand.
        if (TryReadEscape(startingLocation, m_pchLast, &outChar))
        {
            this->RestoreMultiUnits(savedMultiUnits);
            Error(ERRIdAfterLit);
        }
    }

    if (Js::NumberUtilities::IsDigit(*startingLocation))
    {
        this->RestoreMultiUnits(savedMultiUnits);
        Error(ERRbadNumber);
    }

    return pchT;
}